

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

btScalar EdgeSeparation(btBox2dShape *poly1,btTransform *xf1,int edge1,btBox2dShape *poly2,
                       btTransform *xf2)

{
  long lVar1;
  btVector3 bVar2;
  btVector3 bVar3;
  float local_b8;
  float local_98;
  float fStack_94;
  btVector3 normal1;
  btVector3 normal1World;
  btScalar minDot;
  
  normal1World = operator*(&xf1->m_basis,poly1->m_normals + edge1);
  btMatrix3x3::transpose((btMatrix3x3 *)&minDot,&xf2->m_basis);
  normal1 = operator*((btMatrix3x3 *)&minDot,&normal1World);
  minDot = 1e+18;
  lVar1 = btVector3::minDot(&normal1,poly2->m_vertices,4,&minDot);
  bVar2 = btTransform::operator()(xf1,poly1->m_vertices + edge1);
  bVar3 = btTransform::operator()(xf2,poly2->m_vertices + (int)lVar1);
  local_98 = bVar2.m_floats[0];
  fStack_94 = bVar2.m_floats[1];
  local_b8 = bVar2.m_floats[2];
  return (bVar3.m_floats[1] - fStack_94) * normal1World.m_floats[1] +
         normal1World.m_floats[0] * (bVar3.m_floats[0] - local_98) +
         (bVar3.m_floats[2] - local_b8) * normal1World.m_floats[2];
}

Assistant:

static btScalar EdgeSeparation(const btBox2dShape* poly1, const btTransform& xf1, int edge1,
							  const btBox2dShape* poly2, const btTransform& xf2)
{
	const btVector3* vertices1 = poly1->getVertices();
	const btVector3* normals1 = poly1->getNormals();

	int count2 = poly2->getVertexCount();
	const btVector3* vertices2 = poly2->getVertices();

	btAssert(0 <= edge1 && edge1 < poly1->getVertexCount());

	// Convert normal from poly1's frame into poly2's frame.
	btVector3 normal1World = b2Mul(xf1.getBasis(), normals1[edge1]);
	btVector3 normal1 = b2MulT(xf2.getBasis(), normal1World);

	// Find support vertex on poly2 for -normal.
	int index = 0;
	btScalar minDot = BT_LARGE_FLOAT;

    if( count2 > 0 )
        index = (int) normal1.minDot( vertices2, count2, minDot);

	btVector3 v1 = b2Mul(xf1, vertices1[edge1]);
	btVector3 v2 = b2Mul(xf2, vertices2[index]);
	btScalar separation = b2Dot(v2 - v1, normal1World);
	return separation;
}